

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O0

void __thiscall
CRPCCommand::CRPCCommand
          (CRPCCommand *this,string *category,string *name,Actor *actor,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *args,intptr_t unique_id)

{
  long lVar1;
  function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)> *in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __str = in_RDX;
  std::__cxx11::string::string(in_RSI,in_RDX);
  std::__cxx11::string::string(in_RSI,__str);
  ::wallet::_GLOBAL__N_1::std::function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)>::function
            (in_R8,in_RCX);
  ::wallet::_GLOBAL__N_1::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)in_RDX,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)0x371209);
  *(undefined8 *)(in_RDI + 0x78) = in_R9;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CRPCCommand(std::string category, std::string name, Actor actor, std::vector<std::pair<std::string, bool>> args, intptr_t unique_id)
        : category(std::move(category)), name(std::move(name)), actor(std::move(actor)), argNames(std::move(args)),
          unique_id(unique_id)
    {
    }